

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O2

bool __thiscall helics::InputInfo::updateData(InputInfo *this,dataRecord *update,int index)

{
  SmallBuffer *sb1;
  pointer ppVar1;
  bool bVar2;
  pointer ppVar3;
  uint uVar4;
  pointer psVar5;
  
  if (this->only_update_on_change == false) {
    psVar5 = (this->current_data).
             super__Vector_base<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
LAB_0026dd0c:
    std::__shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2> *)
               (psVar5 + index),
               (__shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2> *)&update->data)
    ;
    uVar4 = update->iteration;
    ppVar1 = (this->current_data_time).
             super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = ppVar1 + index;
    ppVar1[index].first.internalTimeCode = (update->time).internalTimeCode;
  }
  else {
    psVar5 = (this->current_data).
             super__Vector_base<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sb1 = psVar5[index].super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr;
    if (sb1 == (SmallBuffer *)0x0) goto LAB_0026dd0c;
    bVar2 = helics::operator!=(sb1,(update->data).
                                   super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
    if (!bVar2) {
      ppVar3 = (this->current_data_time).
               super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (ppVar3[index].first.internalTimeCode != (update->time).internalTimeCode) {
        return false;
      }
      ppVar3 = ppVar3 + index;
      uVar4 = update->iteration;
      bVar2 = false;
      goto LAB_0026dd33;
    }
    std::__shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2> *)
               ((this->current_data).
                super__Vector_base<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
                ._M_impl.super__Vector_impl_data._M_start + index),
               (__shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2> *)&update->data)
    ;
    uVar4 = update->iteration;
    ppVar1 = (this->current_data_time).
             super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = ppVar1 + index;
    ppVar1[index].first.internalTimeCode = (update->time).internalTimeCode;
  }
  bVar2 = true;
LAB_0026dd33:
  ppVar3->second = uVar4;
  return bVar2;
}

Assistant:

bool InputInfo::updateData(dataRecord&& update, int index)
{
    if (!only_update_on_change || !current_data[index]) {
        current_data[index] = std::move(update.data);
        current_data_time[index] = {update.time, update.iteration};
        return true;
    }

    if (*current_data[index] != *(update.data)) {
        current_data[index] = std::move(update.data);
        current_data_time[index] = {update.time, update.iteration};
        return true;
    }
    if (current_data_time[index].first == update.time) {
        // this is for bookkeeping purposes should still return false
        current_data_time[index].second = update.iteration;
    }
    return false;
}